

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostkey.c
# Opt level: O2

int hostkey_method_ssh_dss_initPEM
              (LIBSSH2_SESSION *session,char *privkeyfile,uchar *passphrase,void **abstract)

{
  int iVar1;
  EVP_PKEY *in_RAX;
  EVP_PKEY *dsactx;
  
  dsactx = in_RAX;
  if (*abstract != (void *)0x0) {
    hostkey_method_ssh_dss_dtor(session,abstract);
    *abstract = (void *)0x0;
  }
  iVar1 = _libssh2_dsa_new_private(&dsactx,session,privkeyfile,passphrase);
  if (iVar1 == 0) {
    *abstract = dsactx;
    iVar1 = 0;
  }
  else {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

static int
hostkey_method_ssh_dss_initPEM(LIBSSH2_SESSION * session,
                               const char *privkeyfile,
                               unsigned const char *passphrase,
                               void **abstract)
{
    libssh2_dsa_ctx *dsactx;
    int ret;

    if(*abstract) {
        hostkey_method_ssh_dss_dtor(session, abstract);
        *abstract = NULL;
    }

    ret = _libssh2_dsa_new_private(&dsactx, session, privkeyfile, passphrase);
    if(ret) {
        return -1;
    }

    *abstract = dsactx;

    return 0;
}